

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

void __thiscall crnlib::crn_comp::optimize_color_selectors(crn_comp *this)

{
  uint *puVar1;
  unsigned_short *puVar2;
  ushort uVar3;
  uint32 i_1;
  uint uVar4;
  uint16 i;
  ulong uVar5;
  uint16 i_2;
  uint uVar6;
  uint uVar7;
  vector<unsigned_short> *this_00;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint16 i_3;
  ulong uVar11;
  vector<unsigned_short> indices;
  vector<unsigned_int> selectors;
  uint8 D4 [256];
  uint8 D8 [65536];
  
  this_00 = this->m_selector_remaping;
  uVar9 = (this->m_color_selectors).m_size;
  uVar3 = (ushort)uVar9;
  vector<unsigned_short>::resize(this_00,uVar9 & 0xffff,false);
  for (uVar5 = 0; uVar5 != 0x100; uVar5 = uVar5 + 1) {
    D4[uVar5] = (&DAT_0018cdb8)[(uint)(uVar5 >> 2) & 3 ^ (uint)(uVar5 >> 6) & 0x3ffffff] +
                (&DAT_0018cdb8)[((uint)(uVar5 >> 4) & 0xfffffff ^ (uint)uVar5) & 3];
  }
  for (uVar5 = 0; uVar5 != 0x10000; uVar5 = uVar5 + 1) {
    uVar7 = (uint)(uVar5 >> 4);
    D8[uVar5] = D4[(uint)uVar5 & 0xf | uVar7 & 0xf0] + D4[uVar7 & 0xf | (uint)(uVar5 >> 8) & 0xf0];
  }
  vector<unsigned_int>::vector(&selectors,uVar9 & 0xffff);
  vector<unsigned_short>::vector(&indices,uVar9 & 0xffff);
  puVar1 = (this->m_color_selectors).m_p;
  for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    selectors.m_p[uVar5] = puVar1[uVar5];
    indices.m_p[uVar5] = (unsigned_short)uVar5;
  }
  puVar2 = this_00->m_p;
  uVar9 = 0;
  uVar5 = (ulong)uVar3;
  while (uVar10 = uVar5 - 1, uVar5 != 0) {
    uVar8 = 0;
    uVar7 = 0xffffffff;
    for (uVar11 = 0; uVar5 != uVar11; uVar11 = uVar11 + 1) {
      uVar4 = selectors.m_p[uVar11];
      uVar6 = (uint)D8[(uVar4 & 0xff) << 8 | uVar9 & 0xff] +
              (uint)D8[uVar4 & 0xff00 | uVar9 >> 8 & 0xff] +
              (uint)D8[uVar4 >> 8 & 0xff00 | uVar9 >> 0x10 & 0xff] +
              (uint)D8[uVar4 >> 0x10 & 0xff00 | uVar9 >> 0x18];
      uVar4 = (uint)uVar11;
      if (uVar7 <= uVar6) {
        uVar4 = (uint)uVar8;
        uVar6 = uVar7;
      }
      uVar7 = uVar6;
      uVar8 = (ulong)uVar4;
    }
    uVar8 = uVar8 & 0xffff;
    uVar9 = selectors.m_p[uVar8];
    puVar2[indices.m_p[uVar8]] = uVar3 - (short)uVar5;
    selectors.m_p[uVar8] = selectors.m_p[uVar10];
    indices.m_p[uVar8] = indices.m_p[uVar10];
    uVar5 = uVar10;
  }
  pack_color_selectors(this,&this->m_packed_color_selectors,this_00);
  vector<unsigned_short>::~vector(&indices);
  vector<unsigned_int>::~vector(&selectors);
  return;
}

Assistant:

void crn_comp::optimize_color_selectors()
    {
        crnlib::vector<uint16>& remapping = m_selector_remaping[cColor];
        uint16 n = m_color_selectors.size();
        remapping.resize(n);

        uint8 d[] = { 0, 5, 14, 10 };

        uint8 D4[0x100];
        for (uint16 i = 0; i < 0x100; i++)
        {
            D4[i] = d[(i ^ i >> 4) & 3] + d[(i >> 2 ^ i >> 6) & 3];
        }
        uint8 D8[0x10000];
        for (uint32 i = 0; i < 0x10000; i++)
        {
            D8[i] = D4[(i >> 8 & 0xF0) | (i >> 4 & 0xF)] + D4[(i >> 4 & 0xF0) | (i & 0xF)];
        }

        crnlib::vector<uint32> selectors(n);
        crnlib::vector<uint16> indices(n);
        for (uint16 i = 0; i < n; i++)
        {
            selectors[i] = m_color_selectors[i];
            indices[i] = i;
        }
        uint32 selected_selector = 0;
        for (uint16 left = n; left;)
        {
            uint16 selected_index = 0;
            uint min_error = cUINT32_MAX;
            for (uint16 i = 0; i < left; i++)
            {
                uint32 selector = selectors[i];
                uint8 d0 = D8[(selector >> 16 & 0xFF00) | (selected_selector >> 24 & 0xFF)];
                uint8 d1 = D8[(selector >> 8 & 0xFF00) | (selected_selector >> 16 & 0xFF)];
                uint8 d2 = D8[(selector & 0xFF00) | (selected_selector >> 8 & 0xFF)];
                uint8 d3 = D8[(selector << 8 & 0xFF00) | (selected_selector & 0xFF)];
                uint error = d0 + d1 + d2 + d3;
                if (error < min_error)
                {
                    min_error = error;
                    selected_index = i;
                }
            }
            selected_selector = selectors[selected_index];
            remapping[indices[selected_index]] = n - left;
            left--;
            selectors[selected_index] = selectors[left];
            indices[selected_index] = indices[left];
        }

        pack_color_selectors(m_packed_color_selectors, remapping);
    }